

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# physfs_platform_unix.c
# Opt level: O1

char * readSymLink(char *path)

{
  ssize_t rc;
  char *__buf;
  ssize_t sVar1;
  char *unaff_RBX;
  int iVar2;
  char *pcVar3;
  ssize_t len;
  size_t __len;
  
  __len = 0x40;
  pcVar3 = (char *)0x0;
  do {
    __buf = (char *)(*__PHYSFS_AllocatorHooks.Realloc)(pcVar3,__len);
    iVar2 = 3;
    if ((__buf != (char *)0x0) &&
       (sVar1 = readlink(path,__buf,__len), pcVar3 = __buf, iVar2 = 3, sVar1 != -1)) {
      if (sVar1 < (long)__len) {
        __buf[sVar1] = '\0';
        unaff_RBX = __buf;
        iVar2 = 1;
      }
      else {
        __len = __len * 2;
        iVar2 = 0;
      }
    }
  } while (iVar2 == 0);
  if (iVar2 == 3) {
    if (pcVar3 != (char *)0x0) {
      (*__PHYSFS_AllocatorHooks.Free)(pcVar3);
    }
    unaff_RBX = (char *)0x0;
  }
  return unaff_RBX;
}

Assistant:

static char *readSymLink(const char *path)
{
    ssize_t len = 64;
    ssize_t rc = -1;
    char *retval = NULL;

    while (1)
    {
         char *ptr = (char *) allocator.Realloc(retval, (size_t) len);
         if (ptr == NULL)
             break;   /* out of memory. */
         retval = ptr;

         rc = readlink(path, retval, len);
         if (rc == -1)
             break;  /* not a symlink, i/o error, etc. */

         else if (rc < len)
         {
             retval[rc] = '\0';  /* readlink doesn't null-terminate. */
             return retval;  /* we're good to go. */
         } /* else if */

         len *= 2;  /* grow buffer, try again. */
    } /* while */

    if (retval != NULL)
        allocator.Free(retval);
    return NULL;
}